

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

TaskHandle __thiscall
Task::fromJson(Task *this,int id,
              vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *operands
              ,json *json)

{
  bool bVar1;
  element_type *peVar2;
  const_reference pvVar3;
  unsigned_long uVar4;
  uint64_t uVar5;
  reference pOVar6;
  size_type sVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  double time;
  TaskHandle TVar9;
  OperandUsage *usage_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range1_1;
  OperandUsage *usage;
  iterator __end1;
  iterator __begin1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range1;
  set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
  ins;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78 [3];
  undefined1 local_48 [8];
  anon_class_24_1_ca163648 fill;
  json *json_local;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *operands_local;
  int id_local;
  shared_ptr<Task> *task;
  
  fill.operands.
  super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::make_shared<Task>();
  std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::vector
            ((vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *)
             local_48,operands);
  peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  peVar2->id = id;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)json,"name");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (local_78);
  peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  std::__cxx11::string::operator=((string *)&peVar2->name,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"ins");
  fromJson::anon_class_24_1_ca163648::operator()
            ((anon_class_24_1_ca163648 *)local_48,&peVar2->ins,pvVar3);
  peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"outs");
  fromJson::anon_class_24_1_ca163648::operator()
            ((anon_class_24_1_ca163648 *)local_48,&peVar2->outs,pvVar3);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"workspace");
  uVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator_unsigned_long<unsigned_long,_0>(pvVar3);
  peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  peVar2->workspace = uVar4;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"time");
  time = nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::operator_double<double,_0>(pvVar3);
  uVar5 = Unit::us<double>(time);
  peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  peVar2->duration = uVar5;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"attr");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&ins._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar3);
  peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(&peVar2->attr,
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&ins._M_t._M_impl.super__Rb_tree_header._M_node_count);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&ins._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
  ::set((set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
         *)&__range1);
  peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  __end1 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&peVar2->ins);
  usage = (OperandUsage *)
          std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&peVar2->ins);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                                     *)&usage), bVar1) {
    pOVar6 = __gnu_cxx::
             __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
             ::operator*(&__end1);
    std::
    set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
    ::insert((set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
              *)&__range1,&pOVar6->operand);
    __gnu_cxx::
    __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>::
    operator++(&__end1);
  }
  peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  peVar2->inplace = false;
  peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  __end1_1 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&peVar2->outs);
  usage_1 = (OperandUsage *)
            std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&peVar2->outs);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                        *)&usage_1);
    if (!bVar1) {
LAB_0017b2d5:
      peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          this);
      bVar1 = isForbidden(peVar2);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        fill.operands.
        super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        std::
        set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
        ::~set((set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                *)&__range1);
        fromJson(int,std::vector<std::shared_ptr<Operand>,std::allocator<std::shared_ptr<Operand>>>const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)
        ::
        {lambda(std::vector<OperandUsage,std::allocator<OperandUsage>>&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)#1}
        ::~basic_json((_lambda_std__vector<OperandUsage,std::allocator<OperandUsage>>__nlohmann__basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const___1_
                       *)local_48);
        _Var8._M_pi = extraout_RDX;
        if ((fill.operands.
             super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          std::shared_ptr<Task>::~shared_ptr((shared_ptr<Task> *)this);
          _Var8._M_pi = extraout_RDX_00;
        }
        TVar9.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
        TVar9.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
        return (TaskHandle)TVar9.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>;
      }
      __assert_fail("not task->isForbidden()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LyricZhao[P]DLMO/schedule.hpp"
                    ,0xcb,
                    "static TaskHandle Task::fromJson(int, const std::vector<OperandHandle> &, const nlohmann::json &)"
                   );
    }
    pOVar6 = __gnu_cxx::
             __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
             ::operator*(&__end1_1);
    sVar7 = std::
            set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
            ::count((set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                     *)&__range1,&pOVar6->operand);
    if (sVar7 != 0) {
      peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          this);
      peVar2->inplace = true;
      goto LAB_0017b2d5;
    }
    __gnu_cxx::
    __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>::
    operator++(&__end1_1);
  } while( true );
}

Assistant:

static TaskHandle fromJson(int id, const std::vector<OperandHandle> &operands, const nlohmann::json &json) {
        auto task = std::make_shared<Task>();
        auto fill = [operands](std::vector<OperandUsage> &vec, const nlohmann::json &array) {
            vec.resize(array.size());
            // Python processor has already assumed `arch == "CUDA"`
            for (int i = 0; i < vec.size(); ++ i) {
                vec[i] = OperandUsage{ operands[static_cast<int>(array[i])] };
            }
        };

        // Fill task
        task->id = id;
        task->name = json["name"];
        fill(task->ins, json["ins"]);
        fill(task->outs, json["outs"]);
        task->workspace = json["workspace"];
        task->duration = Unit::us(static_cast<double>(json["time"]));
        task->attr = json["attr"];

        // Detect inplace
        std::set<OperandHandle> ins;
        for (auto &usage: task->ins) {
            ins.insert(usage.operand);
        }
        task->inplace = false;
        for (auto &usage: task->outs) {
            if (ins.count(usage.operand)) {
                task->inplace = true;
                break;
            }
        }

        assert(not task->isForbidden());
        return task;
    }